

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns)

{
  xmlChar *pxVar1;
  xmlNsPtr pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  ulong uVar7;
  xmlNsPtr *ppxVar8;
  int iVar9;
  long lVar10;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam("searching namespaces stack (c14n)");
    return 0;
  }
  if (ns == (xmlNsPtr)0x0) {
    pxVar6 = "";
    pxVar5 = "";
  }
  else {
    pxVar6 = ns->prefix;
    if (pxVar6 == (xmlChar *)0x0) {
      pxVar6 = "";
    }
    pxVar5 = ns->href;
    if (pxVar5 == (xmlChar *)0x0) {
      pxVar5 = "";
    }
  }
  if (*pxVar6 == '\0') {
    ppxVar8 = cur->nsTab;
    if (ppxVar8 == (xmlNsPtr *)0x0) {
      return (uint)(*pxVar5 == '\0');
    }
    if (*pxVar5 == '\0') {
      iVar9 = 0;
      iVar4 = 1;
      goto LAB_00138b66;
    }
  }
  else {
    ppxVar8 = cur->nsTab;
    if (ppxVar8 == (xmlNsPtr *)0x0) {
      return 0;
    }
  }
  iVar9 = cur->nsPrevStart;
  iVar4 = 0;
LAB_00138b66:
  uVar7 = (ulong)(uint)cur->nsCurEnd;
  do {
    if ((int)uVar7 <= iVar9) {
      return iVar4;
    }
    uVar7 = (ulong)(int)uVar7;
    while( true ) {
      pxVar2 = ppxVar8[uVar7 - 1];
      uVar7 = uVar7 - 1;
      if (pxVar2 == (xmlNsPtr)0x0) break;
      pxVar3 = pxVar2->prefix;
      if (pxVar6 == pxVar3) goto LAB_00138bb6;
      if (pxVar3 == (xmlChar *)0x0) break;
      lVar10 = 0;
      while (pxVar1 = pxVar6 + lVar10, *pxVar1 == pxVar3[lVar10]) {
        lVar10 = lVar10 + 1;
        if (*pxVar1 == '\0') goto LAB_00138bb6;
      }
      if ((long)uVar7 <= (long)iVar9) {
        return iVar4;
      }
    }
    if (*pxVar6 == '\0') {
      if (pxVar2 != (xmlNsPtr)0x0) {
LAB_00138bb6:
        pxVar6 = pxVar2->href;
        if (pxVar5 == pxVar6) {
          return 1;
        }
        if (pxVar6 != (xmlChar *)0x0) {
          lVar10 = 0;
          do {
            pxVar3 = pxVar5 + lVar10;
            if (*pxVar3 != pxVar6[lVar10]) {
              return 0;
            }
            lVar10 = lVar10 + 1;
          } while (*pxVar3 != '\0');
          return 1;
        }
      }
      return (uint)(*pxVar5 == '\0');
    }
  } while( true );
}

Assistant:

static int
xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns)
{
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam("searching namespaces stack (c14n)");
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = (has_empty_ns) ? 0 : cur->nsPrevStart;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		return(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL));
	    }
        }
    }
    return(has_empty_ns);
}